

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::BinaryOp_x86_avx512::forward
          (BinaryOp_x86_avx512 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int *piVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int _h;
  int _d;
  uint _c;
  uint _elempack;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  int iVar12;
  int iVar13;
  size_t sVar14;
  uint uVar15;
  Option *pOVar16;
  Mat *pMVar17;
  Mat *a;
  Option *in_R8;
  Mat *pMVar18;
  Option *_elemsize;
  Option *pOVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 local_138 [56];
  uint local_100;
  size_t local_f8;
  ulong local_f0;
  Mat local_e8;
  Mat local_98;
  Mat *local_48;
  Option *local_40;
  BinaryOp_x86_avx512 *local_38;
  
  pMVar18 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar15 = pMVar18[1].dims;
  if (pMVar18[1].dims < pMVar18->dims) {
    uVar15 = pMVar18->dims;
  }
  local_f0 = (ulong)uVar15;
  piVar1 = pMVar18->refcount;
  local_e8.data = pMVar18->data;
  local_e8.refcount._0_4_ = SUB84(pMVar18->refcount,0);
  local_e8.refcount._4_4_ = (undefined4)((ulong)pMVar18->refcount >> 0x20);
  local_e8.elemsize = pMVar18->elemsize;
  local_e8.elempack = pMVar18->elempack;
  local_e8.allocator = pMVar18->allocator;
  uVar4 = pMVar18->dims;
  uVar5 = pMVar18->w;
  uVar6 = pMVar18->h;
  uVar7 = pMVar18->d;
  local_e8.c = pMVar18->c;
  local_e8.cstep = pMVar18->cstep;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  piVar1 = pMVar18[1].refcount;
  local_98.data = pMVar18[1].data;
  local_98.refcount._0_4_ = SUB84(pMVar18[1].refcount,0);
  local_98.refcount._4_4_ = (undefined4)((ulong)pMVar18[1].refcount >> 0x20);
  local_98.elemsize = pMVar18[1].elemsize;
  local_98.elempack = pMVar18[1].elempack;
  local_98.allocator = pMVar18[1].allocator;
  uVar8 = pMVar18[1].dims;
  uVar9 = pMVar18[1].w;
  uVar10 = pMVar18[1].h;
  uVar11 = pMVar18[1].d;
  local_98.c = pMVar18[1].c;
  local_98.cstep = pMVar18[1].cstep;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  local_e8.dims = uVar4;
  local_e8.w = uVar5;
  local_e8.h = uVar6;
  local_e8.d = uVar7;
  local_98.dims = uVar8;
  local_98.w = uVar9;
  local_98.h = uVar10;
  local_98.d = uVar11;
  if (pMVar18->dims < (int)uVar15) {
    if (uVar15 == 2) {
      sVar14 = (long)pMVar18->elempack * (long)pMVar18->w;
      local_e8.w = (int)sVar14;
      if (local_e8.w == pMVar18[1].elempack * pMVar18[1].h) {
        in_R8 = (Option *)opt->workspace_allocator;
        local_e8.w = uVar5;
        Mat::reshape((Mat *)local_138,pMVar18,1,pMVar18->w,(Allocator *)in_R8);
        piVar1 = (int *)CONCAT44(local_138._12_4_,local_138._8_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        piVar1 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (local_e8.allocator == (Allocator *)0x0) {
              if (local_e8.data != (void *)0x0) {
                free(local_e8.data);
              }
            }
            else {
              (*(local_e8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar1 = (int *)CONCAT44(local_138._12_4_,local_138._8_4_);
        local_e8.data = (void *)local_138._0_8_;
        local_e8.refcount._0_4_ = local_138._8_4_;
        local_e8.refcount._4_4_ = local_138._12_4_;
        local_e8.elemsize = local_138._16_8_;
        local_e8.elempack = local_138._24_4_;
        local_e8.allocator = (Allocator *)local_138._32_8_;
        local_e8.dims = local_138._40_4_;
        local_e8.w = local_138._44_4_;
        local_e8.h = local_138._48_4_;
        local_e8.d = local_138._52_4_;
        local_e8.c = local_100;
        local_e8.cstep = local_f8;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if ((Allocator *)local_138._32_8_ == (Allocator *)0x0) {
              if ((void *)local_138._0_8_ != (void *)0x0) {
                free((void *)local_138._0_8_);
              }
            }
            else {
              (*(*(_func_int ***)local_138._32_8_)[3])();
            }
          }
        }
        local_f8 = 0;
        local_138._0_8_ = (void *)0x0;
        local_138._8_4_ = 0;
        local_138._12_4_ = 0;
        local_138._16_8_ = (Option *)0x0;
        local_138._24_4_ = 0;
        local_138._40_16_ = (undefined1  [16])0x0;
        local_100 = 0;
      }
      else {
        local_e8.dims = 2;
        local_e8.elempack = 1;
        local_e8.elemsize = pMVar18->elemsize / (ulong)(long)pMVar18->elempack;
        local_e8.cstep = sVar14;
      }
      uVar15 = (uint)local_f0;
    }
    if ((uVar15 == 3) && (pMVar18->dims == 1)) {
      sVar14 = (long)pMVar18->elempack * (long)pMVar18->w;
      iVar13 = (int)sVar14;
      if (iVar13 == pMVar18[1].elempack * pMVar18[1].c) {
        in_R8 = (Option *)(ulong)(uint)pMVar18->w;
        Mat::reshape((Mat *)local_138,pMVar18,1,1,pMVar18->w,opt->workspace_allocator);
        piVar1 = (int *)CONCAT44(local_138._12_4_,local_138._8_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        piVar1 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (local_e8.allocator == (Allocator *)0x0) {
              if (local_e8.data != (void *)0x0) {
                free(local_e8.data);
              }
            }
            else {
              (*(local_e8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar1 = (int *)CONCAT44(local_138._12_4_,local_138._8_4_);
        local_e8.data = (void *)local_138._0_8_;
        local_e8.refcount._0_4_ = local_138._8_4_;
        local_e8.refcount._4_4_ = local_138._12_4_;
        local_e8.elemsize = local_138._16_8_;
        local_e8.elempack = local_138._24_4_;
        local_e8.allocator = (Allocator *)local_138._32_8_;
        local_e8.dims = local_138._40_4_;
        local_e8.w = local_138._44_4_;
        local_e8.h = local_138._48_4_;
        local_e8.d = local_138._52_4_;
        local_e8.c = local_100;
        local_e8.cstep = local_f8;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if ((Allocator *)local_138._32_8_ == (Allocator *)0x0) {
              if ((void *)local_138._0_8_ != (void *)0x0) {
                free((void *)local_138._0_8_);
              }
            }
            else {
              (*(*(_func_int ***)local_138._32_8_)[3])();
            }
          }
        }
        local_f8 = 0;
        local_138._0_8_ = (void *)0x0;
        local_138._8_4_ = 0;
        local_138._12_4_ = 0;
        local_138._16_8_ = (Option *)0x0;
        local_138._24_4_ = 0;
        local_138._40_16_ = (undefined1  [16])0x0;
        local_100 = 0;
      }
      else {
        local_e8.dims = 3;
        local_e8.elempack = 1;
        local_e8.elemsize = pMVar18->elemsize / (ulong)(long)pMVar18->elempack;
        local_e8.w = iVar13;
        local_e8.cstep = sVar14;
      }
      uVar15 = (uint)local_f0;
    }
    if ((uVar15 == 3) && (pMVar18->dims == 2)) {
      in_R8 = (Option *)(ulong)(uint)pMVar18->h;
      Mat::reshape((Mat *)local_138,pMVar18,1,pMVar18->w,pMVar18->h,opt->workspace_allocator);
      piVar1 = (int *)CONCAT44(local_138._12_4_,local_138._8_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      piVar1 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (local_e8.allocator == (Allocator *)0x0) {
            if (local_e8.data != (void *)0x0) {
              free(local_e8.data);
            }
          }
          else {
            (*(local_e8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar1 = (int *)CONCAT44(local_138._12_4_,local_138._8_4_);
      local_e8.data = (void *)local_138._0_8_;
      local_e8.refcount._0_4_ = local_138._8_4_;
      local_e8.refcount._4_4_ = local_138._12_4_;
      local_e8.elemsize = local_138._16_8_;
      local_e8.elempack = local_138._24_4_;
      local_e8.allocator = (Allocator *)local_138._32_8_;
      local_e8.dims = local_138._40_4_;
      local_e8.w = local_138._44_4_;
      local_e8.h = local_138._48_4_;
      local_e8.d = local_138._52_4_;
      local_e8.c = local_100;
      local_e8.cstep = local_f8;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if ((Allocator *)local_138._32_8_ == (Allocator *)0x0) {
            if ((void *)local_138._0_8_ != (void *)0x0) {
              free((void *)local_138._0_8_);
            }
          }
          else {
            (*(*(_func_int ***)local_138._32_8_)[3])();
          }
        }
      }
      local_f8 = 0;
      local_138._0_8_ = (void *)0x0;
      local_138._8_4_ = 0;
      local_138._12_4_ = 0;
      local_138._16_8_ = (Option *)0x0;
      local_138._24_4_ = 0;
      local_138._40_16_ = (undefined1  [16])0x0;
      local_100 = 0;
      uVar15 = (uint)local_f0;
    }
    if ((uVar15 == 4) && (pMVar18->dims == 1)) {
      sVar14 = (long)pMVar18->elempack * (long)pMVar18->w;
      iVar13 = (int)sVar14;
      if (iVar13 == pMVar18[1].elempack * pMVar18[1].c) {
        in_R8 = (Option *)0x1;
        Mat::reshape((Mat *)local_138,pMVar18,1,1,1,pMVar18->w,opt->workspace_allocator);
        piVar1 = (int *)CONCAT44(local_138._12_4_,local_138._8_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        piVar1 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (local_e8.allocator == (Allocator *)0x0) {
              if (local_e8.data != (void *)0x0) {
                free(local_e8.data);
              }
            }
            else {
              (*(local_e8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar1 = (int *)CONCAT44(local_138._12_4_,local_138._8_4_);
        local_e8.data = (void *)local_138._0_8_;
        local_e8.refcount._0_4_ = local_138._8_4_;
        local_e8.refcount._4_4_ = local_138._12_4_;
        local_e8.elemsize = local_138._16_8_;
        local_e8.elempack = local_138._24_4_;
        local_e8.allocator = (Allocator *)local_138._32_8_;
        local_e8.dims = local_138._40_4_;
        local_e8.w = local_138._44_4_;
        local_e8.h = local_138._48_4_;
        local_e8.d = local_138._52_4_;
        local_e8.c = local_100;
        local_e8.cstep = local_f8;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if ((Allocator *)local_138._32_8_ == (Allocator *)0x0) {
              if ((void *)local_138._0_8_ != (void *)0x0) {
                free((void *)local_138._0_8_);
              }
            }
            else {
              (*(*(_func_int ***)local_138._32_8_)[3])();
            }
          }
        }
        local_f8 = 0;
        local_138._0_8_ = (void *)0x0;
        local_138._8_4_ = 0;
        local_138._12_4_ = 0;
        local_138._16_8_ = (Option *)0x0;
        local_138._24_4_ = 0;
        local_138._40_16_ = (undefined1  [16])0x0;
        local_100 = 0;
      }
      else {
        local_e8.dims = 4;
        local_e8.elempack = 1;
        local_e8.elemsize = pMVar18->elemsize / (ulong)(long)pMVar18->elempack;
        local_e8.w = iVar13;
        local_e8.cstep = sVar14;
      }
      uVar15 = (uint)local_f0;
    }
    if ((uVar15 == 4) && (pMVar18->dims == 2)) {
      in_R8 = (Option *)(ulong)(uint)pMVar18->w;
      Mat::reshape((Mat *)local_138,pMVar18,1,1,pMVar18->w,pMVar18->h,opt->workspace_allocator);
      piVar1 = (int *)CONCAT44(local_138._12_4_,local_138._8_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      piVar1 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (local_e8.allocator == (Allocator *)0x0) {
            if (local_e8.data != (void *)0x0) {
              free(local_e8.data);
            }
          }
          else {
            (*(local_e8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar1 = (int *)CONCAT44(local_138._12_4_,local_138._8_4_);
      local_e8.data = (void *)local_138._0_8_;
      local_e8.refcount._0_4_ = local_138._8_4_;
      local_e8.refcount._4_4_ = local_138._12_4_;
      local_e8.elemsize = local_138._16_8_;
      local_e8.elempack = local_138._24_4_;
      local_e8.allocator = (Allocator *)local_138._32_8_;
      local_e8.dims = local_138._40_4_;
      local_e8.w = local_138._44_4_;
      local_e8.h = local_138._48_4_;
      local_e8.d = local_138._52_4_;
      local_e8.c = local_100;
      local_e8.cstep = local_f8;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if ((Allocator *)local_138._32_8_ == (Allocator *)0x0) {
            if ((void *)local_138._0_8_ != (void *)0x0) {
              free((void *)local_138._0_8_);
            }
          }
          else {
            (*(*(_func_int ***)local_138._32_8_)[3])();
          }
        }
      }
      local_f8 = 0;
      local_138._0_8_ = (void *)0x0;
      local_138._8_4_ = 0;
      local_138._12_4_ = 0;
      local_138._16_8_ = (Option *)0x0;
      local_138._24_4_ = 0;
      local_138._40_16_ = (undefined1  [16])0x0;
      local_100 = 0;
      uVar15 = (uint)local_f0;
    }
    if ((uVar15 == 4) && (pMVar18->dims == 3)) {
      in_R8 = (Option *)(ulong)(uint)pMVar18->h;
      Mat::reshape((Mat *)local_138,pMVar18,1,pMVar18->w,pMVar18->h,pMVar18->c,
                   opt->workspace_allocator);
      piVar1 = (int *)CONCAT44(local_138._12_4_,local_138._8_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      piVar1 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (local_e8.allocator == (Allocator *)0x0) {
            if (local_e8.data != (void *)0x0) {
              free(local_e8.data);
            }
          }
          else {
            (*(local_e8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar1 = (int *)CONCAT44(local_138._12_4_,local_138._8_4_);
      local_e8.data = (void *)local_138._0_8_;
      local_e8.refcount._0_4_ = local_138._8_4_;
      local_e8.refcount._4_4_ = local_138._12_4_;
      local_e8.elemsize = local_138._16_8_;
      local_e8.elempack = local_138._24_4_;
      local_e8.allocator = (Allocator *)local_138._32_8_;
      local_e8.dims = local_138._40_4_;
      local_e8.w = local_138._44_4_;
      local_e8.h = local_138._48_4_;
      local_e8.d = local_138._52_4_;
      local_e8.c = local_100;
      local_e8.cstep = local_f8;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if ((Allocator *)local_138._32_8_ == (Allocator *)0x0) {
            if ((void *)local_138._0_8_ != (void *)0x0) {
              free((void *)local_138._0_8_);
            }
          }
          else {
            (*(*(_func_int ***)local_138._32_8_)[3])();
          }
        }
      }
      local_f8 = 0;
      local_138._0_8_ = (void *)0x0;
      local_138._8_4_ = 0;
      local_138._12_4_ = 0;
      local_138._16_8_ = (Option *)0x0;
      local_138._24_4_ = 0;
      local_138._40_16_ = (undefined1  [16])0x0;
      local_100 = 0;
      uVar15 = (uint)local_f0;
    }
  }
  local_48 = (Mat *)top_blobs;
  if (pMVar18[1].dims < (int)uVar15) {
    pMVar17 = pMVar18 + 1;
    if (uVar15 == 2) {
      sVar14 = (long)pMVar18[1].elempack * (long)pMVar18[1].w;
      iVar13 = (int)sVar14;
      if (iVar13 == pMVar18->elempack * pMVar18->h) {
        in_R8 = (Option *)opt->workspace_allocator;
        Mat::reshape((Mat *)local_138,pMVar17,1,pMVar18[1].w,(Allocator *)in_R8);
        piVar1 = (int *)CONCAT44(local_138._12_4_,local_138._8_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        piVar1 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (local_98.allocator == (Allocator *)0x0) {
              if (local_98.data != (void *)0x0) {
                free(local_98.data);
              }
            }
            else {
              (*(local_98.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar1 = (int *)CONCAT44(local_138._12_4_,local_138._8_4_);
        local_98.data = (void *)local_138._0_8_;
        local_98.refcount._0_4_ = local_138._8_4_;
        local_98.refcount._4_4_ = local_138._12_4_;
        local_98.elemsize = local_138._16_8_;
        local_98.elempack = local_138._24_4_;
        local_98.allocator = (Allocator *)local_138._32_8_;
        local_98.dims = local_138._40_4_;
        local_98.w = local_138._44_4_;
        local_98.h = local_138._48_4_;
        local_98.d = local_138._52_4_;
        local_98.c = local_100;
        local_98.cstep = local_f8;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if ((Allocator *)local_138._32_8_ == (Allocator *)0x0) {
              if ((void *)local_138._0_8_ != (void *)0x0) {
                free((void *)local_138._0_8_);
              }
            }
            else {
              (*(*(_func_int ***)local_138._32_8_)[3])();
            }
          }
        }
        local_f8 = 0;
        local_138._0_8_ = (void *)0x0;
        local_138._8_4_ = 0;
        local_138._12_4_ = 0;
        local_138._16_8_ = (Option *)0x0;
        local_138._24_4_ = 0;
        local_138._40_16_ = (undefined1  [16])0x0;
        local_100 = 0;
      }
      else {
        local_98.dims = 2;
        local_98.elempack = 1;
        local_98.elemsize = pMVar18[1].elemsize / (ulong)(long)pMVar18[1].elempack;
        local_98.w = iVar13;
        local_98.cstep = sVar14;
      }
      uVar15 = (uint)local_f0;
    }
    if ((uVar15 == 3) && (pMVar18[1].dims == 1)) {
      in_R8 = (Option *)(long)pMVar18[1].w;
      sVar14 = (long)pMVar18[1].elempack * (long)in_R8;
      iVar13 = (int)sVar14;
      if (iVar13 == pMVar18->elempack * pMVar18->c) {
        Mat::reshape((Mat *)local_138,pMVar17,1,1,pMVar18[1].w,opt->workspace_allocator);
        piVar1 = (int *)CONCAT44(local_138._12_4_,local_138._8_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        piVar1 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (local_98.allocator == (Allocator *)0x0) {
              if (local_98.data != (void *)0x0) {
                free(local_98.data);
              }
            }
            else {
              (*(local_98.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar1 = (int *)CONCAT44(local_138._12_4_,local_138._8_4_);
        local_98.data = (void *)local_138._0_8_;
        local_98.refcount._0_4_ = local_138._8_4_;
        local_98.refcount._4_4_ = local_138._12_4_;
        local_98.elemsize = local_138._16_8_;
        local_98.elempack = local_138._24_4_;
        local_98.allocator = (Allocator *)local_138._32_8_;
        local_98.dims = local_138._40_4_;
        local_98.w = local_138._44_4_;
        local_98.h = local_138._48_4_;
        local_98.d = local_138._52_4_;
        local_98.c = local_100;
        local_98.cstep = local_f8;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if ((Allocator *)local_138._32_8_ == (Allocator *)0x0) {
              if ((void *)local_138._0_8_ != (void *)0x0) {
                free((void *)local_138._0_8_);
              }
            }
            else {
              (*(*(_func_int ***)local_138._32_8_)[3])();
            }
          }
        }
        local_f8 = 0;
        local_138._0_8_ = (void *)0x0;
        local_138._8_4_ = 0;
        local_138._12_4_ = 0;
        local_138._16_8_ = (Option *)0x0;
        local_138._24_4_ = 0;
        local_138._40_16_ = (undefined1  [16])0x0;
        local_100 = 0;
      }
      else {
        local_98.dims = 3;
        local_98.elempack = 1;
        local_98.elemsize = pMVar18[1].elemsize / (ulong)(long)pMVar18[1].elempack;
        local_98.w = iVar13;
        local_98.cstep = sVar14;
      }
      uVar15 = (uint)local_f0;
    }
    if ((uVar15 == 3) && (pMVar18[1].dims == 2)) {
      in_R8 = (Option *)(ulong)(uint)pMVar18[1].h;
      Mat::reshape((Mat *)local_138,pMVar17,1,pMVar18[1].w,pMVar18[1].h,opt->workspace_allocator);
      piVar1 = (int *)CONCAT44(local_138._12_4_,local_138._8_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      piVar1 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (local_98.allocator == (Allocator *)0x0) {
            if (local_98.data != (void *)0x0) {
              free(local_98.data);
            }
          }
          else {
            (*(local_98.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar1 = (int *)CONCAT44(local_138._12_4_,local_138._8_4_);
      local_98.data = (void *)local_138._0_8_;
      local_98.refcount._0_4_ = local_138._8_4_;
      local_98.refcount._4_4_ = local_138._12_4_;
      local_98.elemsize = local_138._16_8_;
      local_98.elempack = local_138._24_4_;
      local_98.allocator = (Allocator *)local_138._32_8_;
      local_98.dims = local_138._40_4_;
      local_98.w = local_138._44_4_;
      local_98.h = local_138._48_4_;
      local_98.d = local_138._52_4_;
      local_98.c = local_100;
      local_98.cstep = local_f8;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if ((Allocator *)local_138._32_8_ == (Allocator *)0x0) {
            if ((void *)local_138._0_8_ != (void *)0x0) {
              free((void *)local_138._0_8_);
            }
          }
          else {
            (*(*(_func_int ***)local_138._32_8_)[3])();
          }
        }
      }
      local_f8 = 0;
      local_138._0_8_ = (void *)0x0;
      local_138._8_4_ = 0;
      local_138._12_4_ = 0;
      local_138._16_8_ = (Option *)0x0;
      local_138._24_4_ = 0;
      local_138._40_16_ = (undefined1  [16])0x0;
      local_100 = 0;
      uVar15 = (uint)local_f0;
    }
    if ((uVar15 == 4) && (pMVar18[1].dims == 1)) {
      sVar14 = (long)pMVar18[1].elempack * (long)pMVar18[1].w;
      iVar13 = (int)sVar14;
      if (iVar13 == pMVar18->elempack * pMVar18->c) {
        in_R8 = (Option *)0x1;
        Mat::reshape((Mat *)local_138,pMVar17,1,1,1,pMVar18[1].w,opt->workspace_allocator);
        piVar1 = (int *)CONCAT44(local_138._12_4_,local_138._8_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        piVar1 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (local_98.allocator == (Allocator *)0x0) {
              if (local_98.data != (void *)0x0) {
                free(local_98.data);
              }
            }
            else {
              (*(local_98.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar1 = (int *)CONCAT44(local_138._12_4_,local_138._8_4_);
        local_98.data = (void *)local_138._0_8_;
        local_98.refcount._0_4_ = local_138._8_4_;
        local_98.refcount._4_4_ = local_138._12_4_;
        local_98.elemsize = local_138._16_8_;
        local_98.elempack = local_138._24_4_;
        local_98.allocator = (Allocator *)local_138._32_8_;
        local_98.dims = local_138._40_4_;
        local_98.w = local_138._44_4_;
        local_98.h = local_138._48_4_;
        local_98.d = local_138._52_4_;
        local_98.c = local_100;
        local_98.cstep = local_f8;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if ((Allocator *)local_138._32_8_ == (Allocator *)0x0) {
              if ((void *)local_138._0_8_ != (void *)0x0) {
                free((void *)local_138._0_8_);
              }
            }
            else {
              (*(*(_func_int ***)local_138._32_8_)[3])();
            }
          }
        }
        local_f8 = 0;
        local_138._0_8_ = (void *)0x0;
        local_138._8_4_ = 0;
        local_138._12_4_ = 0;
        local_138._16_8_ = (Option *)0x0;
        local_138._24_4_ = 0;
        local_138._40_16_ = (undefined1  [16])0x0;
        local_100 = 0;
      }
      else {
        local_98.dims = 4;
        local_98.elempack = 1;
        local_98.elemsize = pMVar18[1].elemsize / (ulong)(long)pMVar18[1].elempack;
        local_98.w = iVar13;
        local_98.cstep = sVar14;
      }
      uVar15 = (uint)local_f0;
    }
    if ((uVar15 == 4) && (pMVar18[1].dims == 2)) {
      in_R8 = (Option *)(ulong)(uint)pMVar18[1].w;
      Mat::reshape((Mat *)local_138,pMVar17,1,1,pMVar18[1].w,pMVar18[1].h,opt->workspace_allocator);
      piVar1 = (int *)CONCAT44(local_138._12_4_,local_138._8_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      piVar1 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (local_98.allocator == (Allocator *)0x0) {
            if (local_98.data != (void *)0x0) {
              free(local_98.data);
            }
          }
          else {
            (*(local_98.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar1 = (int *)CONCAT44(local_138._12_4_,local_138._8_4_);
      local_98.data = (void *)local_138._0_8_;
      local_98.refcount._0_4_ = local_138._8_4_;
      local_98.refcount._4_4_ = local_138._12_4_;
      local_98.elemsize = local_138._16_8_;
      local_98.elempack = local_138._24_4_;
      local_98.allocator = (Allocator *)local_138._32_8_;
      local_98.dims = local_138._40_4_;
      local_98.w = local_138._44_4_;
      local_98.h = local_138._48_4_;
      local_98.d = local_138._52_4_;
      local_98.c = local_100;
      local_98.cstep = local_f8;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if ((Allocator *)local_138._32_8_ == (Allocator *)0x0) {
            if ((void *)local_138._0_8_ != (void *)0x0) {
              free((void *)local_138._0_8_);
            }
          }
          else {
            (*(*(_func_int ***)local_138._32_8_)[3])();
          }
        }
      }
      local_f8 = 0;
      local_138._0_8_ = (void *)0x0;
      local_138._8_4_ = 0;
      local_138._12_4_ = 0;
      local_138._16_8_ = (Option *)0x0;
      local_138._24_4_ = 0;
      local_138._40_16_ = (undefined1  [16])0x0;
      local_100 = 0;
      uVar15 = (uint)local_f0;
    }
    if ((uVar15 == 4) && (pMVar18[1].dims == 3)) {
      in_R8 = (Option *)(ulong)(uint)pMVar18[1].h;
      Mat::reshape((Mat *)local_138,pMVar17,1,pMVar18[1].w,pMVar18[1].h,pMVar18[1].c,
                   opt->workspace_allocator);
      piVar1 = (int *)CONCAT44(local_138._12_4_,local_138._8_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      piVar1 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (local_98.allocator == (Allocator *)0x0) {
            if (local_98.data != (void *)0x0) {
              free(local_98.data);
            }
          }
          else {
            (*(local_98.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar1 = (int *)CONCAT44(local_138._12_4_,local_138._8_4_);
      local_98.data = (void *)local_138._0_8_;
      local_98.refcount._0_4_ = local_138._8_4_;
      local_98.refcount._4_4_ = local_138._12_4_;
      local_98.elemsize = local_138._16_8_;
      local_98.elempack = local_138._24_4_;
      local_98.allocator = (Allocator *)local_138._32_8_;
      local_98.dims = local_138._40_4_;
      local_98.w = local_138._44_4_;
      local_98.h = local_138._48_4_;
      local_98.d = local_138._52_4_;
      local_98.c = local_100;
      local_98.cstep = local_f8;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if ((Allocator *)local_138._32_8_ == (Allocator *)0x0) {
            if ((void *)local_138._0_8_ != (void *)0x0) {
              free((void *)local_138._0_8_);
            }
          }
          else {
            (*(*(_func_int ***)local_138._32_8_)[3])();
          }
        }
      }
      local_f8 = 0;
      local_138._0_8_ = (void *)0x0;
      local_138._8_4_ = 0;
      local_138._12_4_ = 0;
      local_138._16_8_ = (Option *)0x0;
      local_138._24_4_ = 0;
      local_138._40_16_ = (undefined1  [16])0x0;
      local_100 = 0;
      uVar15 = (uint)local_f0;
    }
  }
  iVar13 = local_98.w;
  if (local_98.w < local_e8.w) {
    iVar13 = local_e8.w;
  }
  _h = local_98.h;
  if (local_98.h < local_e8.h) {
    _h = local_e8.h;
  }
  _d = local_98.d;
  if (local_98.d < local_e8.d) {
    _d = local_e8.d;
  }
  _c = local_98.c;
  if (local_98.c < local_e8.c) {
    _c = local_e8.c;
  }
  pOVar16 = (Option *)(ulong)_c;
  _elemsize = (Option *)local_98.elemsize;
  if (local_98.elemsize < local_e8.elemsize) {
    _elemsize = (Option *)local_e8.elemsize;
  }
  _elempack = local_98.elempack;
  if (local_98.elempack < local_e8.elempack) {
    _elempack = local_e8.elempack;
  }
  pOVar19 = (Option *)(ulong)_elempack;
  pMVar18 = (Mat *)local_48->data;
  local_40 = opt;
  local_38 = this;
  switch(uVar15) {
  case 1:
    in_R8 = (Option *)opt->blob_allocator;
    local_48 = pMVar18;
    Mat::create(pMVar18,iVar13,(size_t)_elemsize,_elempack,(Allocator *)in_R8);
    iVar12 = (int)local_f0;
    pMVar18 = local_48;
    if (iVar12 == 4) goto switchD_003cdfce_caseD_4;
    if (iVar12 == 3) goto switchD_003cdfce_caseD_3;
    if (iVar12 == 2) goto switchD_003cdfce_caseD_2;
    break;
  case 2:
switchD_003cdfce_caseD_2:
    local_48 = pMVar18;
    Mat::create(local_48,iVar13,_h,(size_t)_elemsize,_elempack,local_40->blob_allocator);
    pMVar18 = local_48;
    if ((int)local_f0 == 4) goto switchD_003cdfce_caseD_4;
    in_R8 = pOVar19;
    if ((int)local_f0 == 3) goto switchD_003cdfce_caseD_3;
    break;
  case 3:
switchD_003cdfce_caseD_3:
    local_48 = pMVar18;
    in_R8 = _elemsize;
    Mat::create(local_48,iVar13,_h,_c,(size_t)_elemsize,_elempack,local_40->blob_allocator);
    pMVar18 = local_48;
    if ((int)local_f0 == 4) goto switchD_003cdfce_caseD_4;
    break;
  case 4:
switchD_003cdfce_caseD_4:
    local_48 = pMVar18;
    Mat::create(local_48,iVar13,_h,_d,_c,(size_t)_elemsize,_elempack,local_40->blob_allocator);
    in_R8 = pOVar16;
    pMVar18 = local_48;
  }
  iVar13 = -100;
  if ((pMVar18->data == (void *)0x0) || ((long)pMVar18->c * pMVar18->cstep == 0)) goto LAB_003ce1a5;
  if (local_e8.elempack < local_98.elempack) {
LAB_003ce138:
    iVar13 = (local_38->super_BinaryOp).op_type;
    uVar15 = iVar13 - 1;
    if ((uVar15 < 0xb) && ((0x7e5U >> (uVar15 & 0x1f) & 1) != 0)) {
      iVar13 = *(int *)(&DAT_005fbac0 + (ulong)uVar15 * 4);
    }
    a = &local_98;
    pMVar17 = &local_e8;
  }
  else {
    if (local_e8.elempack == local_98.elempack) {
      auVar20._8_8_ = CONCAT44(local_e8.c,local_e8.d);
      auVar20._0_8_ = CONCAT44(local_e8.c,local_e8.d);
      auVar2._4_4_ = local_e8.h;
      auVar2._0_4_ = local_e8.w;
      auVar2._8_4_ = local_e8.d;
      auVar2._12_4_ = local_e8.c;
      auVar2 = vpmulld_avx(auVar20,auVar2);
      auVar3 = vpshufd_avx(auVar2,0x55);
      auVar2 = vpmulld_avx(auVar2,auVar3);
      auVar21._8_8_ = CONCAT44(local_98.c,local_98.d);
      auVar21._0_8_ = CONCAT44(local_98.c,local_98.d);
      auVar3._4_4_ = local_98.h;
      auVar3._0_4_ = local_98.w;
      auVar3._8_4_ = local_98.d;
      auVar3._12_4_ = local_98.c;
      auVar3 = vpmulld_avx(auVar21,auVar3);
      auVar20 = vpshufd_avx(auVar3,0x55);
      auVar3 = vpmulld_avx(auVar3,auVar20);
      if (auVar2._0_4_ * local_e8.elempack < auVar3._0_4_ * local_98.elempack) goto LAB_003ce138;
    }
    iVar13 = (local_38->super_BinaryOp).op_type;
    a = &local_e8;
    pMVar17 = &local_98;
  }
  binary_op_broadcast(a,pMVar17,pMVar18,iVar13,in_R8);
  iVar13 = 0;
LAB_003ce1a5:
  piVar1 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_98.allocator == (Allocator *)0x0) {
        if (local_98.data != (void *)0x0) {
          free(local_98.data);
        }
      }
      else {
        (*(local_98.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_98.cstep = 0;
  local_98.data = (void *)0x0;
  local_98.refcount._0_4_ = 0;
  local_98.refcount._4_4_ = 0;
  local_98.elemsize = 0;
  local_98.elempack = 0;
  local_98.dims = 0;
  local_98.w = 0;
  local_98.h = 0;
  local_98.d = 0;
  local_98.c = 0;
  piVar1 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_e8.allocator == (Allocator *)0x0) {
        if (local_e8.data != (void *)0x0) {
          free(local_e8.data);
        }
      }
      else {
        (*(local_e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar13;
}

Assistant:

int BinaryOp_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& A = bottom_blobs[0];
    const Mat& B = bottom_blobs[1];
    const int outdims = std::max(A.dims, B.dims);

    Mat A2 = A;
    Mat B2 = B;
    if (A.dims < outdims)
    {
        // expand inner axes
        if (outdims == 2)
        {
            if (A.w * A.elempack == B.h * B.elempack)
                A2 = A.reshape(1, A.w, opt.workspace_allocator);
            else // if (A.w == B.w)
            {
                A2.dims = 2;
                A2.w = A.w * A.elempack;
                A2.elempack = 1;
                A2.elemsize = A.elemsize / A.elempack;
                A2.cstep = A2.w;
            }
        }
        if (outdims == 3 && A.dims == 1)
        {
            if (A.w * A.elempack == B.c * B.elempack)
                A2 = A.reshape(1, 1, A.w, opt.workspace_allocator);
            else // if (A.w == B.w)
            {
                A2.dims = 3;
                A2.w = A.w * A.elempack;
                A2.elempack = 1;
                A2.elemsize = A.elemsize / A.elempack;
                A2.cstep = A2.w;
            }
        }
        if (outdims == 3 && A.dims == 2)
            A2 = A.reshape(1, A.w, A.h, opt.workspace_allocator);
        if (outdims == 4 && A.dims == 1)
        {
            if (A.w * A.elempack == B.c * B.elempack)
                A2 = A.reshape(1, 1, 1, A.w, opt.workspace_allocator);
            else // if (A.w == B.w)
            {
                A2.dims = 4;
                A2.w = A.w * A.elempack;
                A2.elempack = 1;
                A2.elemsize = A.elemsize / A.elempack;
                A2.cstep = A2.w;
            }
        }
        if (outdims == 4 && A.dims == 2)
            A2 = A.reshape(1, 1, A.w, A.h, opt.workspace_allocator);
        if (outdims == 4 && A.dims == 3)
            A2 = A.reshape(1, A.w, A.h, A.c, opt.workspace_allocator);
    }
    if (B.dims < outdims)
    {
        // expand inner axes
        if (outdims == 2)
        {
            if (B.w * B.elempack == A.h * A.elempack)
                B2 = B.reshape(1, B.w, opt.workspace_allocator);
            else // if (B.w == A.w)
            {
                B2.dims = 2;
                B2.w = B.w * B.elempack;
                B2.elempack = 1;
                B2.elemsize = B.elemsize / B.elempack;
                B2.cstep = B2.w;
            }
        }
        if (outdims == 3 && B.dims == 1)
        {
            if (B.w * B.elempack == A.c * A.elempack)
                B2 = B.reshape(1, 1, B.w, opt.workspace_allocator);
            else // if (B.w == A.w)
            {
                B2.dims = 3;
                B2.w = B.w * B.elempack;
                B2.elempack = 1;
                B2.elemsize = B.elemsize / B.elempack;
                B2.cstep = B2.w;
            }
        }
        if (outdims == 3 && B.dims == 2)
            B2 = B.reshape(1, B.w, B.h, opt.workspace_allocator);
        if (outdims == 4 && B.dims == 1)
        {
            if (B.w * B.elempack == A.c * A.elempack)
                B2 = B.reshape(1, 1, 1, B.w, opt.workspace_allocator);
            else // if (B.w == A.w)
            {
                B2.dims = 4;
                B2.w = B.w * B.elempack;
                B2.elempack = 1;
                B2.elemsize = B.elemsize / B.elempack;
                B2.cstep = B2.w;
            }
        }
        if (outdims == 4 && B.dims == 2)
            B2 = B.reshape(1, 1, B.w, B.h, opt.workspace_allocator);
        if (outdims == 4 && B.dims == 3)
            B2 = B.reshape(1, B.w, B.h, B.c, opt.workspace_allocator);
    }

    const int outw = std::max(A2.w, B2.w);
    const int outh = std::max(A2.h, B2.h);
    const int outd = std::max(A2.d, B2.d);
    const int outc = std::max(A2.c, B2.c);
    const size_t out_elemsize = std::max(A2.elemsize, B2.elemsize);
    const int out_elempack = std::max(A2.elempack, B2.elempack);

    Mat& top_blob = top_blobs[0];
    if (outdims == 1)
    {
        top_blob.create(outw, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (outdims == 2)
    {
        top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (outdims == 3)
    {
        top_blob.create(outw, outh, outc, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (outdims == 4)
    {
        top_blob.create(outw, outh, outd, outc, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    const bool a_pack_is_lower = A2.elempack < B2.elempack;
    const bool a_pack_is_equal = A2.elempack == B2.elempack;
    const bool a_size_is_lower = A2.w * A2.h * A2.d * A2.c * A2.elempack < B2.w * B2.h * B2.d * B2.c * B2.elempack;
    if (a_pack_is_lower || (a_pack_is_equal && a_size_is_lower))
    {
        binary_op_broadcast(B2, A2, top_blob, get_reverse_op_type(op_type), opt);
    }
    else
    {
        binary_op_broadcast(A2, B2, top_blob, op_type, opt);
    }

    return 0;
}